

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matrix.h
# Opt level: O2

void __thiscall sptk::Matrix::~Matrix(Matrix *this)

{
  this->_vptr_Matrix = (_func_int **)&PTR__Matrix_00114d30;
  std::_Vector_base<double_*,_std::allocator<double_*>_>::~_Vector_base
            (&(this->index_).super__Vector_base<double_*,_std::allocator<double_*>_>);
  std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
            (&(this->data_).super__Vector_base<double,_std::allocator<double>_>);
  return;
}

Assistant:

virtual ~Matrix() {
  }